

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O0

ssize_t tnt_object_container_close(tnt_stream *s)

{
  char cVar1;
  uint size_00;
  long *plVar2;
  long *plVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  ulong local_50;
  size_t sz;
  char *lenp;
  size_t offset;
  mp_type type;
  size_t size;
  tnt_sbuf_object *sbo;
  tnt_stream_buf *sb;
  tnt_stream *s_local;
  
  plVar2 = (long *)s->data;
  plVar3 = *(long **)((long)s->data + 0x30);
  if ((char)plVar3[1] == '\0') {
    s_local = (tnt_stream *)0xffffffffffffffff;
  }
  else {
    size_00 = *(uint *)(*plVar3 + (long)(int)(*(byte *)(plVar3 + 1) - 1) * 0x10 + 8);
    cVar1 = *(char *)(*plVar3 + (long)(int)(*(byte *)(plVar3 + 1) - 1) * 0x10 + 0xc);
    lVar4 = *(long *)(*plVar3 + (long)(int)(*(byte *)(plVar3 + 1) - 1) * 0x10);
    if ((cVar1 == '\x06') && ((size_00 & 1) != 0)) {
      s_local = (tnt_stream *)0xffffffffffffffff;
    }
    else {
      *(char *)(plVar3 + 1) = (char)plVar3[1] + -1;
      if (*(int *)((long)plVar3 + 0xc) == 0) {
        s_local = (tnt_stream *)0x0;
      }
      else if (*(int *)((long)plVar3 + 0xc) == 1) {
        if (cVar1 == '\x06') {
          mp_encode_map32((char *)(*plVar2 + lVar4),size_00 >> 1);
        }
        else {
          mp_encode_array32((char *)(*plVar2 + lVar4),size_00);
        }
        s_local = (tnt_stream *)0x0;
      }
      else if (*(int *)((long)plVar3 + 0xc) == 2) {
        if (cVar1 == '\x06') {
          uVar5 = mp_sizeof_map(size_00 >> 1);
        }
        else {
          uVar5 = mp_sizeof_array(size_00);
        }
        local_50 = (ulong)uVar5;
        if (1 < local_50) {
          lVar6 = (*(code *)plVar2[4])(s,local_50 - 1);
          if (lVar6 == 0) {
            return -1;
          }
          memmove((void *)(*plVar2 + lVar4 + local_50),(void *)(*plVar2 + lVar4 + 1),
                  (plVar2[1] - lVar4) - 1);
        }
        if (cVar1 == '\x06') {
          mp_encode_map((char *)(*plVar2 + lVar4),size_00 >> 1);
        }
        else {
          mp_encode_array((char *)(*plVar2 + lVar4),size_00);
        }
        plVar2[1] = (local_50 - 1) + plVar2[1];
        s_local = (tnt_stream *)0x0;
      }
      else {
        s_local = (tnt_stream *)0xffffffffffffffff;
      }
    }
  }
  return (ssize_t)s_local;
}

Assistant:

ssize_t
tnt_object_container_close (struct tnt_stream *s)
{
	struct tnt_stream_buf   *sb = TNT_SBUF_CAST(s);
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size == 0) return -1;
	size_t       size   = sbo->stack[sbo->stack_size - 1].size;
	enum mp_type type   = sbo->stack[sbo->stack_size - 1].type;
	size_t       offset = sbo->stack[sbo->stack_size - 1].offset;
	if (type == MP_MAP && size % 2) return -1;
	sbo->stack_size -= 1;
	char *lenp = sb->data + offset;
	if (sbo->type == TNT_SBO_SIMPLE) {
		return 0;
	} else if (sbo->type == TNT_SBO_SPARSE) {
		if (type == MP_MAP)
			mp_encode_map32(lenp, size/2);
		else
			mp_encode_array32(lenp, size);
		return 0;
	} else if (sbo->type == TNT_SBO_PACKED) {
		size_t sz = 0;
		if (type == MP_MAP)
			sz = mp_sizeof_map(size/2);
		else
			sz = mp_sizeof_array(size);
		if (sz > 1) {
			if (!sb->resize(s, sz - 1))
				return -1;
			lenp = sb->data + offset;
			memmove(lenp + sz, lenp + 1, sb->size - offset - 1);
		}
		if (type == MP_MAP) {
			mp_encode_map(sb->data + offset, size/2);
		} else {
			mp_encode_array(sb->data + offset, size);
		}
		sb->size += (sz - 1);
		return 0;
	}
	return -1;
}